

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QCommonArrayOps<unsigned_int>::growAppend
          (QCommonArrayOps<unsigned_int> *this,uint *b,uint *e)

{
  long n;
  uint *puVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<unsigned_int> local_48;
  uint *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = b;
  if (b != e) {
    n = (long)e - (long)b >> 2;
    local_48.d = (Data *)0x0;
    local_48.ptr = (uint *)0x0;
    local_48.size = 0;
    puVar1 = (this->super_Type).super_QArrayDataPointer<unsigned_int>.ptr;
    if ((b < puVar1) ||
       (puVar1 + (this->super_Type).super_QArrayDataPointer<unsigned_int>.size <= b)) {
      QArrayDataPointer<unsigned_int>::detachAndGrow
                ((QArrayDataPointer<unsigned_int> *)this,GrowsAtEnd,n,(uint **)0x0,
                 (QArrayDataPointer<unsigned_int> *)0x0);
      puVar1 = b;
    }
    else {
      QArrayDataPointer<unsigned_int>::detachAndGrow
                ((QArrayDataPointer<unsigned_int> *)this,GrowsAtEnd,n,&local_28,&local_48);
      puVar1 = local_28;
    }
    QPodArrayOps<unsigned_int>::copyAppend
              (&this->super_Type,puVar1,(uint *)(((long)e - (long)b) + (long)puVar1));
    if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d)->super_QArrayData,4,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }